

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_point_query_base.h
# Opt level: O0

void __thiscall
S2ClosestPointQueryBase<S2MinDistance,_int>::InitQueue
          (S2ClosestPointQueryBase<S2MinDistance,_int> *this)

{
  S2CellId id_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Options *pOVar4;
  S2Point *pSVar5;
  PointData *pPVar6;
  S2Region *pSVar7;
  Options *pOVar8;
  ulong uVar9;
  size_type sVar10;
  const_reference pvVar11;
  S2CellId x;
  S2CellId y;
  S1ChordAngle SVar12;
  S1ChordAngle SVar13;
  byte local_249;
  S2CellId local_1b8;
  S2CellId id;
  int i;
  undefined1 local_1a0 [8];
  S2Cap search_cap;
  S1ChordAngle radius;
  S2RegionCoverer coverer_1;
  undefined1 local_f0 [8];
  S2RegionCoverer coverer;
  vector<S2CellId,_std::allocator<S2CellId>_> *initial_cells;
  S2CellId local_74;
  undefined4 local_6c;
  undefined1 local_68 [8];
  S2Cap cap;
  S2LogMessage local_28;
  S2LogMessageVoidify local_11;
  S2ClosestPointQueryBase<S2MinDistance,_int> *local_10;
  S2ClosestPointQueryBase<S2MinDistance,_int> *this_local;
  
  local_10 = this;
  bVar1 = std::
          priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
          ::empty(&this->queue_);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_point_query_base.h"
               ,0x23a,kFatal,(ostream *)&std::cerr);
    poVar3 = S2LogMessage::stream(&local_28);
    poVar3 = std::operator<<(poVar3,"Check failed: queue_.empty() ");
    S2LogMessageVoidify::operator&(&local_11,poVar3);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  (*this->target_->_vptr_S2DistanceTarget[2])();
  bVar1 = S2Cap::is_empty((S2Cap *)local_68);
  if (bVar1) {
    local_6c = 1;
  }
  else {
    pOVar4 = options(this);
    iVar2 = S2ClosestPointQueryBaseOptions<S2MinDistance>::max_results(pOVar4);
    if (iVar2 == 1) {
      pSVar5 = S2Cap::center((S2Cap *)local_68);
      S2CellId::S2CellId(&local_74,pSVar5);
      S2PointIndex<int>::Iterator::Seek(&this->iter_,local_74);
      bVar1 = S2PointIndex<int>::Iterator::done(&this->iter_);
      if (!bVar1) {
        pPVar6 = S2PointIndex<int>::Iterator::point_data(&this->iter_);
        MaybeAddResult(this,pPVar6);
      }
      bVar1 = S2PointIndex<int>::Iterator::Prev(&this->iter_);
      if (bVar1) {
        pPVar6 = S2PointIndex<int>::Iterator::point_data(&this->iter_);
        MaybeAddResult(this,pPVar6);
      }
      SVar13.length2_ = (this->distance_limit_).super_S1ChordAngle.length2_;
      SVar12.length2_ = (double)S2MinDistance::Zero();
      bVar1 = ::operator==(SVar13,SVar12);
      if (bVar1) {
        local_6c = 1;
        goto LAB_004023b1;
      }
    }
    bVar1 = std::vector<S2CellId,_std::allocator<S2CellId>_>::empty(&this->index_covering_);
    if (bVar1) {
      InitCovering(this);
    }
    coverer._80_8_ = &this->index_covering_;
    pOVar4 = options(this);
    pSVar7 = S2ClosestPointQueryBaseOptions<S2MinDistance>::region(pOVar4);
    if (pSVar7 != (S2Region *)0x0) {
      S2RegionCoverer::S2RegionCoverer((S2RegionCoverer *)local_f0);
      pOVar8 = S2RegionCoverer::mutable_options((S2RegionCoverer *)local_f0);
      S2RegionCoverer::Options::set_max_cells(pOVar8,4);
      pOVar4 = options(this);
      pSVar7 = S2ClosestPointQueryBaseOptions<S2MinDistance>::region(pOVar4);
      S2RegionCoverer::GetCovering((S2RegionCoverer *)local_f0,pSVar7,&this->region_covering_);
      S2CellUnion::GetIntersection
                (&this->index_covering_,&this->region_covering_,&this->intersection_with_region_);
      coverer._80_8_ = &this->intersection_with_region_;
      S2RegionCoverer::~S2RegionCoverer((S2RegionCoverer *)local_f0);
    }
    SVar13.length2_ = (this->distance_limit_).super_S1ChordAngle.length2_;
    SVar12.length2_ = (double)S2MinDistance::Infinity();
    bVar1 = ::operator<(SVar13,SVar12);
    if (bVar1) {
      S2RegionCoverer::S2RegionCoverer((S2RegionCoverer *)&radius);
      pOVar8 = S2RegionCoverer::mutable_options((S2RegionCoverer *)&radius);
      S2RegionCoverer::Options::set_max_cells(pOVar8,4);
      SVar13 = S2Cap::radius((S2Cap *)local_68);
      search_cap.radius_ = S2MinDistance::GetChordAngleBound(&this->distance_limit_);
      SVar13 = ::operator+(SVar13,search_cap.radius_);
      pSVar5 = S2Cap::center((S2Cap *)local_68);
      S2Cap::S2Cap((S2Cap *)local_1a0,pSVar5,SVar13);
      S2RegionCoverer::GetFastCovering
                ((S2RegionCoverer *)&radius,(S2Region *)local_1a0,&this->max_distance_covering_);
      S2CellUnion::GetIntersection
                ((vector<S2CellId,_std::allocator<S2CellId>_> *)coverer._80_8_,
                 &this->max_distance_covering_,&this->intersection_with_max_distance_);
      coverer._80_8_ = &this->intersection_with_max_distance_;
      S2Cap::~S2Cap((S2Cap *)local_1a0);
      S2RegionCoverer::~S2RegionCoverer((S2RegionCoverer *)&radius);
    }
    S2PointIndex<int>::Iterator::Begin(&this->iter_);
    id.id_._4_4_ = 0;
    while( true ) {
      uVar9 = (ulong)id.id_._4_4_;
      sVar10 = std::vector<S2CellId,_std::allocator<S2CellId>_>::size
                         ((vector<S2CellId,_std::allocator<S2CellId>_> *)coverer._80_8_);
      local_249 = 0;
      if (uVar9 < sVar10) {
        bVar1 = S2PointIndex<int>::Iterator::done(&this->iter_);
        local_249 = bVar1 ^ 0xff;
      }
      if ((local_249 & 1) == 0) break;
      pvVar11 = std::vector<S2CellId,_std::allocator<S2CellId>_>::operator[]
                          ((vector<S2CellId,_std::allocator<S2CellId>_> *)coverer._80_8_,
                           (long)id.id_._4_4_);
      id_00.id_ = pvVar11->id_;
      local_1b8.id_ = id_00.id_;
      x = S2CellId::range_min(&local_1b8);
      y = S2PointIndex<int>::Iterator::id(&this->iter_);
      bVar1 = operator>(x,y);
      ProcessOrEnqueue(this,id_00,&this->iter_,bVar1);
      id.id_._4_4_ = id.id_._4_4_ + 1;
    }
    local_6c = 0;
  }
LAB_004023b1:
  S2Cap::~S2Cap((S2Cap *)local_68);
  return;
}

Assistant:

void S2ClosestPointQueryBase<Distance, Data>::InitQueue() {
  S2_DCHECK(queue_.empty());

  // Optimization: rather than starting with the entire index, see if we can
  // limit the search region to a small disc.  Then we can find a covering for
  // that disc and intersect it with the covering for the index.  This can
  // save a lot of work when the search region is small.
  S2Cap cap = target_->GetCapBound();
  if (cap.is_empty()) return;  // Empty target.
  if (options().max_results() == 1) {
    // If the user is searching for just the closest point, we can compute an
    // upper bound on search radius by seeking to the center of the target's
    // bounding cap and looking at the adjacent index points (in S2CellId
    // order).  The minimum distance to either of these points is an upper
    // bound on the search radius.
    //
    // TODO(ericv): The same strategy would also work for small values of
    // max_results() > 1, e.g. max_results() == 20, except that we would need to
    // examine more neighbors (at least 20, and preferably 20 in each
    // direction).  It's not clear whether this is a common case, though, and
    // also this would require extending MaybeAddResult() so that it can
    // remove duplicate entries.  (The points added here may be re-added by
    // ProcessOrEnqueue(), but this is okay when max_results() == 1.)
    iter_.Seek(S2CellId(cap.center()));
    if (!iter_.done()) {
      MaybeAddResult(&iter_.point_data());
    }
    if (iter_.Prev()) {
      MaybeAddResult(&iter_.point_data());
    }
    // Skip the rest of the algorithm if we found a matching point.
    if (distance_limit_ == Distance::Zero()) return;
  }
  // We start with a covering of the set of indexed points, then intersect it
  // with the given region (if any) and maximum search radius disc (if any).
  if (index_covering_.empty()) InitCovering();
  const std::vector<S2CellId>* initial_cells = &index_covering_;
  if (options().region()) {
    S2RegionCoverer coverer;
    coverer.mutable_options()->set_max_cells(4);
    coverer.GetCovering(*options().region(), &region_covering_);
    S2CellUnion::GetIntersection(index_covering_, region_covering_,
                                 &intersection_with_region_);
    initial_cells = &intersection_with_region_;
  }
  if (distance_limit_ < Distance::Infinity()) {
    S2RegionCoverer coverer;
    coverer.mutable_options()->set_max_cells(4);
    S1ChordAngle radius = cap.radius() + distance_limit_.GetChordAngleBound();
    S2Cap search_cap(cap.center(), radius);
    coverer.GetFastCovering(search_cap, &max_distance_covering_);
    S2CellUnion::GetIntersection(*initial_cells, max_distance_covering_,
                                 &intersection_with_max_distance_);
    initial_cells = &intersection_with_max_distance_;
  }
  iter_.Begin();
  for (int i = 0; i < initial_cells->size() && !iter_.done(); ++i) {
    S2CellId id = (*initial_cells)[i];
    ProcessOrEnqueue(id, &iter_, id.range_min() > iter_.id() /*seek*/);
  }
}